

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

Self * __thiscall
jsonnet::internal::Allocator::clone<jsonnet::internal::Self>(Allocator *this,Self *ast)

{
  value_type this_00;
  value_type local_20;
  
  this_00 = (value_type)operator_new(0x80);
  Self::Self((Self *)this_00,ast);
  local_20 = this_00;
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (&this->allocated,&local_20);
  return (Self *)this_00;
}

Assistant:

T *clone(T *ast)
    {
        auto r = new T(*ast);
        allocated.push_back(r);
        return r;
    }